

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  string *this_00;
  string *this_01;
  undefined1 *this_02;
  cmCTest *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  rep rVar9;
  char *extraout_RDX;
  long lVar10;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  char *pcVar12;
  pointer pcVar13;
  char *pcVar14;
  char **ppcVar15;
  cmDuration cVar16;
  string_view value;
  int retVal;
  char *local_8d0 [4];
  long local_8b0;
  ostringstream cmCTestLog_msg_14;
  cmXMLWriter xml;
  string local_6d8;
  string local_6b8;
  string makeCommand;
  cmGeneratedFileStream xofs;
  string local_410;
  cmGeneratedFileStream ofs;
  cmStringReplaceHelper colorRemover;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
  poVar8 = std::operator<<((ostream *)&ofs,"Build project");
  std::endl<char,std::char_traits<char>>(poVar8);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x126,(char *)xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>
                              ._vptr_basic_ostream,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&xofs);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
  cVar16 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar7 = 0;
  if (120.0 <= cVar16.__r) {
    this_02 = &xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    for (lVar10 = 0; lVar10 != 0x80; lVar10 = lVar10 + 0x10) {
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._184_8_ = 0;
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._200_8_ = 0;
      pcVar12 = *(char **)((long)&cmCTestWarningErrorFileLine[0].RegularExpressionString + lVar10);
      xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._208_4_ = 0;
      memset(this_02,0,0xaa);
      bVar5 = cmsys::RegularExpression::compile((RegularExpression *)this_02,pcVar12);
      if (bVar5) {
        xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             *(_func_int ***)((long)&cmCTestWarningErrorFileLine[0].FileIndex + lVar10);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>
                  (&this->ErrorWarningFileLineRegex,(cmCTestCompileErrorWarningRex *)&xofs);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar8 = std::operator<<((ostream *)&ofs,"Problem Compiling regular expression: ");
        poVar8 = std::operator<<(poVar8,pcVar12);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x13b,_cmCTestLog_msg_14,false);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)this_02);
    }
    GetMakeCommand_abi_cxx11_(&makeCommand,this);
    if (makeCommand._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
      poVar8 = std::operator<<((ostream *)&ofs,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x144,(char *)xofs.super_ofstream.
                                  super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream,false);
      std::__cxx11::string::~string((string *)&xofs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
      iVar7 = -1;
    }
    else {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ofs,"BuildDirectory",(allocator<char> *)&xofs);
      cmCTest::GetCTestConfiguration(&local_6b8,pcVar1,(string *)&ofs);
      std::__cxx11::string::~string((string *)&ofs);
      if (local_6b8._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ofs);
        poVar8 = std::operator<<((ostream *)&ofs,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x14d,(char *)xofs.super_ofstream.
                                    super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream,false);
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ofs);
        iVar7 = -1;
      }
      else {
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ofs,"UseLaunchers",(allocator<char> *)&xofs);
        cmCTest::GetCTestConfiguration(&local_6d8,pcVar1,(string *)&ofs);
        std::__cxx11::string::~string((string *)&ofs);
        value._M_str = extraout_RDX;
        value._M_len = (size_t)local_6d8._M_dataplus._M_p;
        bVar5 = cmValue::IsOn((cmValue *)local_6d8._M_string_length,value);
        this->UseCTestLaunch = bVar5;
        cmGeneratedFileStream::cmGeneratedFileStream(&ofs,None);
        lVar10 = std::chrono::_V2::steady_clock::now();
        bVar5 = cmCTestGenericHandler::StartLogFile(&this->super_cmCTestGenericHandler,"Build",&ofs)
        ;
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Cannot create build log file");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x15a,_cmCTestLog_msg_14,false);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        }
        for (ppcVar15 = cmCTestErrorMatches; *ppcVar15 != (char *)0x0; ppcVar15 = ppcVar15 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,ppcVar15);
        }
        for (ppcVar15 = cmCTestErrorExceptions; *ppcVar15 != (char *)0x0; ppcVar15 = ppcVar15 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,ppcVar15);
        }
        for (ppcVar15 = cmCTestWarningMatches; *ppcVar15 != (char *)0x0; ppcVar15 = ppcVar15 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,ppcVar15);
        }
        for (ppcVar15 = cmCTestWarningExceptions; *ppcVar15 != (char *)0x0; ppcVar15 = ppcVar15 + 1)
        {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,ppcVar15);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->ErrorMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        local_8b0 = lVar10;
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x17e,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar2 = (this->CustomErrorMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = (this->CustomErrorMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
            pbVar11 = pbVar11 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomErrorMatches: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar11);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x17e,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorMatchRegex,pbVar11);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->ErrorExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x180,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar2 = (this->CustomErrorExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = (this->CustomErrorExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
            pbVar11 = pbVar11 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomErrorExceptions: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar11);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x180,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorExceptionRegex,pbVar11);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->WarningMatchRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x182,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar2 = (this->CustomWarningMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = (this->CustomWarningMatches).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
            pbVar11 = pbVar11 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomWarningMatches: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar11);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x182,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningMatchRegex,pbVar11);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
        poVar8 = std::ostream::_M_insert<void_const*>(&xofs);
        poVar8 = std::operator<<(poVar8,"Add this->WarningExceptionRegex");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x184,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
        pbVar2 = (this->CustomWarningExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = (this->CustomWarningExceptions).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
            pbVar11 = pbVar11 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Add this->CustomWarningExceptions: ");
          poVar8 = std::operator<<(poVar8,(string *)pbVar11);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x184,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningExceptionRegex,pbVar11);
        }
        (this->SimplifySourceDir)._M_string_length = 0;
        *(this->SimplifySourceDir)._M_dataplus._M_p = '\0';
        (this->SimplifyBuildDir)._M_string_length = 0;
        *(this->SimplifyBuildDir)._M_dataplus._M_p = '\0';
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_14,"SourceDirectory",(allocator<char> *)&colorRemover);
        cmCTest::GetCTestConfiguration((string *)&xofs,pcVar1,(string *)&cmCTestLog_msg_14);
        uVar4 = xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_;
        this_00 = &this->SimplifySourceDir;
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        if (0x14 < (ulong)uVar4) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&colorRemover,"SourceDirectory",(allocator<char> *)&xml);
          cmCTest::GetCTestConfiguration
                    ((string *)&cmCTestLog_msg_14,pcVar1,&colorRemover.ErrorString);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg_14,"/");
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::string::~string((string *)&colorRemover);
          lVar10 = std::__cxx11::string::rfind((char)&xofs,0x2f);
          if (lVar10 != -1) {
            std::__cxx11::string::resize((ulong)&xofs);
            std::__cxx11::string::operator=((string *)this_00,(string *)&xofs);
          }
          std::__cxx11::string::~string((string *)&xofs);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCTestLog_msg_14,"BuildDirectory",(allocator<char> *)&colorRemover);
        cmCTest::GetCTestConfiguration((string *)&xofs,pcVar1,(string *)&cmCTestLog_msg_14);
        this_01 = &this->SimplifyBuildDir;
        std::__cxx11::string::~string((string *)&xofs);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
        if (0x14 < (ulong)xofs.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _8_8_) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&colorRemover,"BuildDirectory",(allocator<char> *)&xml);
          cmCTest::GetCTestConfiguration
                    ((string *)&cmCTestLog_msg_14,pcVar1,&colorRemover.ErrorString);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&xofs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cmCTestLog_msg_14,"/");
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::string::~string((string *)&colorRemover);
          lVar10 = std::__cxx11::string::rfind((char)&xofs,0x2f);
          if (lVar10 != -1) {
            std::__cxx11::string::resize((ulong)&xofs);
            std::__cxx11::string::operator=((string *)this_01,(string *)&xofs);
          }
          std::__cxx11::string::~string((string *)&xofs);
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        rVar9 = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = rVar9;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&xofs,"\x1b\\[[0-9;]*m",(allocator<char> *)&cmCTestLog_msg_14);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,"",(allocator<char> *)&xml);
        cmStringReplaceHelper::cmStringReplaceHelper
                  (&colorRemover,(string *)&xofs,&local_410,(cmMakefile *)0x0);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&xofs);
        this->ColorRemover = &colorRemover;
        retVal = 0;
        bVar5 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&xofs);
          poVar8 = std::operator<<((ostream *)&xofs,"Build with command: ");
          poVar8 = std::operator<<(poVar8,(string *)&makeCommand);
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ac,_cmCTestLog_msg_14,(this->super_cmCTestGenericHandler).Quiet);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&xofs);
          bVar5 = false;
        }
        else {
          iVar7 = RunMakeCommand(this,&makeCommand,&retVal,local_6b8._M_dataplus._M_p,0,
                                 (ostream *)&ofs,Auto);
          bVar5 = iVar7 != 4;
        }
        cmCTest::CurrentTime_abi_cxx11_((string *)&xofs,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&xofs);
        std::__cxx11::string::~string((string *)&xofs);
        rVar9 = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = rVar9;
        lVar10 = std::chrono::_V2::steady_clock::now();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          pcVar3 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar13 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar13 != pcVar3;
              pcVar13 = pcVar13 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar13->Text,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar13->PreContext,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar13->PostContext,(this_00->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          pcVar3 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar13 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar13 != pcVar3;
              pcVar13 = pcVar13 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar13->Text,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar13->PreContext,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar13->PostContext,(this_01->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream(&xofs,None);
        bVar6 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",&xofs);
        if (bVar6) {
          cmXMLWriter::cmXMLWriter(&xml,(ostream *)&xofs,0);
          GenerateXMLHeader(this,&xml);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,&xml);
          }
          else {
            GenerateXMLLogScraped(this,&xml);
          }
          GenerateXMLFooter(this,&xml,(cmDuration)((double)(lVar10 - local_8b0) / 1000000000.0));
          if ((bVar5 || retVal != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
            poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"Error(s) when building project")
            ;
            std::endl<char,std::char_traits<char>>(poVar8);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1de,local_8d0[0],false);
            std::__cxx11::string::~string((string *)local_8d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"   ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->TotalErrors);
          pcVar14 = " or more";
          pcVar12 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar12 = "";
          }
          poVar8 = std::operator<<(poVar8,pcVar12);
          poVar8 = std::operator<<(poVar8," Compiler errors");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1e5,local_8d0[0],false);
          std::__cxx11::string::~string((string *)local_8d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"   ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar14 = "";
          }
          poVar8 = std::operator<<(poVar8,pcVar14);
          poVar8 = std::operator<<(poVar8," Compiler warnings");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ea,local_8d0[0],false);
          std::__cxx11::string::~string((string *)local_8d0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          iVar7 = retVal;
          cmXMLWriter::~cmXMLWriter(&xml);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_14);
          poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_14,"Cannot create build XML file");
          std::endl<char,std::char_traits<char>>(poVar8);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1d0,(char *)xml.Output,false);
          std::__cxx11::string::~string((string *)&xml);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_14);
          iVar7 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream(&xofs);
        cmStringReplaceHelper::~cmStringReplaceHelper(&colorRemover);
        cmGeneratedFileStream::~cmGeneratedFileStream(&ofs);
        std::__cxx11::string::~string((string *)&local_6d8);
      }
      std::__cxx11::string::~string((string *)&local_6b8);
    }
    std::__cxx11::string::~string((string *)&makeCommand);
  }
  return iVar7;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmIsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    cc = srcdir.rfind('/', srcdir.size() - 2);
    if (cc != std::string::npos) {
      srcdir.resize(cc + 1);
      this->SimplifySourceDir = std::move(srcdir);
    }
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    cc = bindir.rfind('/', bindir.size() - 2);
    if (cc != std::string::npos) {
      bindir.resize(cc + 1);
      this->SimplifyBuildDir = std::move(bindir);
    }
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();

  cmStringReplaceHelper colorRemover("\x1b\\[[0-9;]*m", "", nullptr);
  this->ColorRemover = &colorRemover;
  int retVal = 0;
  int res = cmsysProcess_State_Exited;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (res != cmsysProcess_State_Exited || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}